

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getExpectedValue_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  int iVar1;
  pointer ptVar2;
  TestError *this_00;
  float fVar3;
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
  case MATRIX:
  case MATRIX_ROWS:
    fVar3 = (float)(ptVar2[iVar1].m_n_rows * ptVar2[iVar1].m_n_cols);
    break;
  case STRUCT:
    fVar3 = 8.0;
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    fVar3 = 4.0;
    break;
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_VECTOR:
  case UNSIZED_ARRAY_MATRIX:
    fVar3 = (float)(ptVar2[iVar1].m_n_rows * ptVar2[iVar1].m_n_cols) * 4.0;
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    fVar3 = 32.0;
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
    fVar3 = 12.0;
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    fVar3 = 28.0;
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    fVar3 = 48.0;
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    fVar3 = 16.0;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x35df);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,'@');
  sprintf((__return_storage_ptr__->_M_dataplus)._M_p,"%f",(double)(fVar3 * 0.0625));
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getExpectedValue()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	GLfloat value = 0.0f;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
		value = (GLfloat)(test_case.m_n_cols * test_case.m_n_rows);
		break;
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
		value = (GLfloat)(test_case.m_n_cols * test_case.m_n_rows) * 4.0f;
		break;
	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		value = 4.0f;
		break;
	case STRUCT:
		value = 8.0f;
		break;
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
		value = 12.0f;
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		value = 16.0f;
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		value = 28.0f;
		break;
	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		value = 32.0f;
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		value = 48.0f;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	value *= m_value;

	std::string expected_value;
	expected_value.resize(64, 0);

	sprintf(&expected_value[0], "%f", value);

	return expected_value;
}